

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O1

double __thiscall Curve::getYofX(Curve *this,double x)

{
  double *pdVar1;
  long lVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  pdVar1 = (this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar7 = *pdVar1;
  if (x <= dVar7) {
    pdVar3 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    lVar2 = (long)(this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    uVar5 = lVar2 >> 3;
    bVar6 = 1 < uVar5;
    if (bVar6) {
      dVar8 = pdVar1[1];
      uVar4 = 1;
      if (dVar8 < x) {
        do {
          if ((2 - uVar5) + uVar4 == 1) {
            bVar6 = false;
            goto LAB_0012bec1;
          }
          dVar8 = pdVar1[uVar4 + 1];
          uVar4 = uVar4 + 1;
        } while (dVar8 < x);
        bVar6 = uVar4 < uVar5;
      }
      dVar8 = dVar8 - pdVar1[uVar4 - 1];
      pdVar3 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = pdVar3[uVar4 - 1];
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        dVar7 = dVar7 + (pdVar3[uVar4] - dVar7) * ((x - pdVar1[uVar4 - 1]) / dVar8);
      }
    }
LAB_0012bec1:
    if (bVar6) {
      return dVar7;
    }
    pdVar3 = (pointer)((long)(this->yData).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar2 + -8);
  }
  return *pdVar3;
}

Assistant:

double Curve::getYofX(double x)
{
    if ( x <= xData[0] ) return yData[0];

    for (vector<double>::size_type i = 1; i < xData.size(); i++)
    {
        if ( x <= xData[i] )
        {
            double dx = xData[i] - xData[i-1];
            if ( dx == 0.0 ) return yData[i-1];
            return yData[i-1] + (x - xData[i-1]) / dx * (yData[i] - yData[i-1]);
        }
    }
    return yData[xData.size()-1];
}